

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

uint64_t __thiscall cmLocalGenerator::GetBackwardsCompatibility(cmLocalGenerator *this)

{
  cmMakefile *this_00;
  int iVar1;
  char *pcVar2;
  uint64_t uVar3;
  ulong uVar4;
  uint minor;
  uint major;
  uint local_48;
  allocator<char> local_41;
  uint local_40;
  int local_3c;
  string local_38;
  
  if (this->BackwardsCompatibilityFinal == true) {
    return this->BackwardsCompatibility;
  }
  local_3c = 0;
  local_48 = 0;
  local_40 = 0;
  this_00 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_BACKWARDS_COMPATIBILITY",&local_41);
  pcVar2 = cmMakefile::GetDefinition(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (pcVar2 != (char *)0x0) {
    uVar4 = 0;
    iVar1 = __isoc99_sscanf(pcVar2,"%u.%u.%u",&local_3c,&local_48,&local_40);
    if (iVar1 != 1) {
      if (iVar1 != 2) {
        uVar4 = (ulong)local_40 % 100000000;
      }
      goto LAB_0027557b;
    }
    local_48 = 0;
  }
  uVar4 = 0;
LAB_0027557b:
  uVar3 = ((ulong)local_48 % 1000 + (ulong)(uint)(local_3c * 1000)) * 100000000 + uVar4;
  this->BackwardsCompatibility = uVar3;
  this->BackwardsCompatibilityFinal = true;
  return uVar3;
}

Assistant:

KWIML_INT_uint64_t cmLocalGenerator::GetBackwardsCompatibility()
{
  // The computed version may change until the project is fully
  // configured.
  if (!this->BackwardsCompatibilityFinal) {
    unsigned int major = 0;
    unsigned int minor = 0;
    unsigned int patch = 0;
    if (const char* value =
          this->Makefile->GetDefinition("CMAKE_BACKWARDS_COMPATIBILITY")) {
      switch (sscanf(value, "%u.%u.%u", &major, &minor, &patch)) {
        case 2:
          patch = 0;
          break;
        case 1:
          minor = 0;
          patch = 0;
          break;
        default:
          break;
      }
    }
    this->BackwardsCompatibility = CMake_VERSION_ENCODE(major, minor, patch);
    this->BackwardsCompatibilityFinal = true;
  }

  return this->BackwardsCompatibility;
}